

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

int x25519_key_exchange(ptls_iovec_t *pubkey,ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  ptls_iovec_t pVar1;
  uint8_t *local_68;
  size_t local_60;
  int local_54;
  uint8_t *puStack_50;
  int ret;
  uint8_t *pub;
  uint8_t priv [32];
  ptls_iovec_t *secret_local;
  ptls_iovec_t *pubkey_local;
  ptls_iovec_t peerkey_local;
  
  puStack_50 = (uint8_t *)0x0;
  priv._24_8_ = secret;
  if (peerkey.len == 0x20) {
    puStack_50 = (uint8_t *)malloc(0x20);
    if (puStack_50 == (uint8_t *)0x0) {
      local_54 = 0x201;
    }
    else {
      x25519_create_keypair((uint8_t *)&pub,puStack_50);
      local_54 = x25519_derive_secret
                           ((ptls_iovec_t *)priv._24_8_,(uint8_t *)0x0,peerkey.base,(uint8_t *)&pub,
                            puStack_50);
      if (local_54 == 0) {
        pVar1 = ptls_iovec_init(puStack_50,0x20);
        local_68 = pVar1.base;
        pubkey->base = local_68;
        local_60 = pVar1.len;
        pubkey->len = local_60;
        local_54 = 0;
      }
    }
  }
  else {
    local_54 = 0x33;
  }
  (*ptls_clear_memory)(&pub,0x20);
  if ((puStack_50 != (uint8_t *)0x0) && (local_54 != 0)) {
    (*ptls_clear_memory)(puStack_50,8);
  }
  return local_54;
}

Assistant:

static int x25519_key_exchange(ptls_iovec_t *pubkey, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    uint8_t priv[X25519_KEY_SIZE], *pub = NULL;
    int ret;

    if (peerkey.len != X25519_KEY_SIZE) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    if ((pub = malloc(X25519_KEY_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    x25519_create_keypair(priv, pub);
    if ((ret = x25519_derive_secret(secret, NULL, peerkey.base, priv, pub)) != 0)
        goto Exit;

    *pubkey = ptls_iovec_init(pub, X25519_KEY_SIZE);
    ret = 0;

Exit:
    ptls_clear_memory(priv, sizeof(priv));
    if (pub != NULL && ret != 0)
        ptls_clear_memory(pub, sizeof(pub));
    return ret;
}